

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O3

void __thiscall
polyscope::pick::setSelection(pick *this,pair<polyscope::Structure_*,_unsigned_long> newPick)

{
  currLocalPickInd = newPick.first;
  if (this == (pick *)0x0) {
    currLocalPickInd = (Structure *)0x0;
  }
  haveSelectionVal = this != (pick *)0x0;
  currPickStructure = this;
  return;
}

Assistant:

void setSelection(std::pair<Structure*, size_t> newPick) {
  if (newPick.first == nullptr) {
    resetSelection();
  } else {
    haveSelectionVal = true;
    currPickStructure = newPick.first;
    currLocalPickInd = newPick.second;
  }
}